

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cte.cpp
# Opt level: O0

int __thiscall merlin::cte::init(cte *this,EVP_PKEY_CTX *ctx)

{
  edge *peVar1;
  ulong uVar2;
  bool bVar3;
  int extraout_EAX;
  ostream *poVar4;
  size_type sVar5;
  reference pvVar6;
  size_t sVar7;
  void *pvVar8;
  vector<merlin::factor,_std::allocator<merlin::factor>_> *pvVar9;
  reference this_00;
  variable_set *__x;
  edge *peVar10;
  reference ppeVar11;
  unsigned_long *puVar12;
  double dVar13;
  double dVar14;
  variable vVar15;
  double elapsed;
  size_t local_2a8;
  size_t local_2a0;
  size_t local_298;
  value_type local_290;
  edge *e;
  size_t i_2;
  size_t max_sepset_size;
  size_t max_clique_size;
  vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  clusters;
  graph g;
  __normal_iterator<const_merlin::factor_*,_std::vector<merlin::factor,_std::allocator<merlin::factor>_>_>
  local_180;
  const_iterator i_1;
  vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> fin;
  size_t n;
  size_t wstar;
  ostream_iterator<unsigned_long,_char,_std::char_traits<char>_> local_140;
  ostream_iterator<unsigned_long,_char,_std::char_traits<char>_> *local_130;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_128;
  Type local_11c;
  variable_order_t local_118;
  undefined1 local_100 [8];
  factor q;
  variable local_90;
  ulong local_80;
  size_t i;
  variable_set scope;
  ostream_iterator<unsigned_long,_char,_std::char_traits<char>_> local_30;
  ostream_iterator<unsigned_long,_char,_std::char_traits<char>_> *local_20;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_18;
  cte *local_10;
  cte *this_local;
  
  local_10 = this;
  if (0 < this->m_verbose) {
    poVar4 = std::operator<<((ostream *)&std::cout,"[CTE] + inference task   : ");
    poVar4 = merlin::operator<<(poVar4,&this->m_task);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  bVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty(&this->m_query);
  if (!bVar3) {
    if (0 < this->m_verbose) {
      std::operator<<((ostream *)&std::cout,"[CTE] + query vars       : ");
      local_18._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->m_query);
      local_20 = (ostream_iterator<unsigned_long,_char,_std::char_traits<char>_> *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(&this->m_query);
      std::ostream_iterator<unsigned_long,_char,_std::char_traits<char>_>::ostream_iterator
                (&local_30,(ostream_type *)&std::cout," ");
      std::
      copy<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::ostream_iterator<unsigned_long,char,std::char_traits<char>>>
                ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )&scope.m_d,local_18,local_20);
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    }
    sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->m_query);
    if (sVar5 < 6) {
      variable_set::variable_set((variable_set *)&i);
      local_80 = 0;
      while( true ) {
        uVar2 = local_80;
        sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->m_query);
        if (sVar5 <= uVar2) break;
        pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->m_query,local_80);
        vVar15 = graphical_model::var(&this->m_gmo,*pvVar6);
        local_90 = vVar15;
        variable_set::operator|=((variable_set *)&i,&local_90);
        local_80 = local_80 + 1;
      }
      factor::factor((factor *)local_100,(variable_set *)&i,1.0);
      graphical_model::add_factor(&this->m_gmo,(factor *)local_100);
      factor::~factor((factor *)local_100);
      variable_set::~variable_set((variable_set *)&i);
    }
  }
  sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->m_order);
  if (sVar5 == 0) {
    local_11c = (this->m_order_method).t_;
    graphical_model::order(&local_118,&this->m_gmo,(OrderMethod)local_11c);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(&this->m_order,&local_118)
    ;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_118);
  }
  if (0 < this->m_verbose) {
    poVar4 = std::operator<<((ostream *)&std::cout,"[CTE] + ordering method  : ");
    poVar4 = merlin::operator<<(poVar4,&this->m_order_method);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"[CTE] + elimination      : ");
    local_128._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->m_order);
    local_130 = (ostream_iterator<unsigned_long,_char,_std::char_traits<char>_> *)
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(&this->m_order);
    std::ostream_iterator<unsigned_long,_char,_std::char_traits<char>_>::ostream_iterator
              (&local_140,(ostream_type *)&std::cout," ");
    std::
    copy<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::ostream_iterator<unsigned_long,char,std::char_traits<char>>>
              ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )&wstar,local_128,local_130);
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    sVar7 = graphical_model::induced_width(&this->m_gmo,&this->m_order);
    poVar4 = std::operator<<((ostream *)&std::cout,"[CTE] + induced width    : ");
    pvVar8 = (void *)std::ostream::operator<<(poVar4,sVar7);
    std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"[CTE] + exact inference  : Yes");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"[CTE] + ordering time    : ");
    dVar13 = timeSystem();
    poVar4 = (ostream *)
             std::ostream::operator<<(poVar4,dVar13 - (this->super_algorithm).m_start_time);
    poVar4 = std::operator<<(poVar4," seconds");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"[CTE] Building clique tree ... ");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  sVar7 = graph::num_nodes(&(this->m_gmo).super_graph);
  std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>::vector
            ((vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> *)&i_1);
  pvVar9 = graphical_model::get_factors(&this->m_gmo);
  local_180._M_current =
       (factor *)std::vector<merlin::factor,_std::allocator<merlin::factor>_>::begin(pvVar9);
  while( true ) {
    pvVar9 = graphical_model::get_factors(&this->m_gmo);
    g.m_evacant.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Deque_impl_data._M_finish._M_node =
         (_Map_pointer)std::vector<merlin::factor,_std::allocator<merlin::factor>_>::end(pvVar9);
    bVar3 = __gnu_cxx::operator!=
                      (&local_180,
                       (__normal_iterator<const_merlin::factor_*,_std::vector<merlin::factor,_std::allocator<merlin::factor>_>_>
                        *)((long)&g.m_evacant.c.
                                  super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Deque_impl_data._M_finish + 0x18));
    if (!bVar3) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_merlin::factor_*,_std::vector<merlin::factor,_std::allocator<merlin::factor>_>_>
              ::operator*(&local_180);
    __x = factor::vars(this_00);
    std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>::push_back
              ((vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> *)&i_1,__x);
    __gnu_cxx::
    __normal_iterator<const_merlin::factor_*,_std::vector<merlin::factor,_std::allocator<merlin::factor>_>_>
    ::operator++(&local_180);
  }
  graph::graph((graph *)&clusters.
                         super__Vector_base<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar7);
  graph::init((graph *)&clusters.
                        super__Vector_base<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(EVP_PKEY_CTX *)&i_1);
  graph::triangulate((graph *)&clusters.
                               super__Vector_base<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->m_order);
  graph::maximal_cliques
            ((vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
              *)&max_clique_size,
             (graph *)&clusters.
                       super__Vector_base<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->m_order);
  build_clique_tree(this,(vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                          *)&max_clique_size);
  if (0 < this->m_verbose) {
    poVar4 = std::operator<<((ostream *)&std::cout,"[CTE] Created clique tree with ");
    sVar5 = std::vector<merlin::detail::node,_std::allocator<merlin::detail::node>_>::size
                      (&this->m_clusters);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar5);
    poVar4 = std::operator<<(poVar4," clique factors");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  max_sepset_size = 0;
  i_2 = 0;
  e = (edge *)0x0;
  while( true ) {
    peVar1 = e;
    peVar10 = (edge *)std::vector<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>::
                      size(&this->m_edges);
    if (peVar10 <= peVar1) break;
    ppeVar11 = std::vector<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>::
               operator[](&this->m_edges,(size_type)e);
    local_290 = *ppeVar11;
    local_298 = variable_set::size(&local_290->first->clique);
    puVar12 = std::max<unsigned_long>(&max_sepset_size,&local_298);
    max_sepset_size = *puVar12;
    local_2a0 = variable_set::size(&local_290->second->clique);
    puVar12 = std::max<unsigned_long>(&max_sepset_size,&local_2a0);
    max_sepset_size = *puVar12;
    local_2a8 = variable_set::size(&local_290->sepset);
    puVar12 = std::max<unsigned_long>(&i_2,&local_2a8);
    i_2 = *puVar12;
    e = (edge *)((long)&(e->sepset).m_v.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start + 1);
  }
  this->m_logz = 0.0;
  std::vector<merlin::factor,_std::allocator<merlin::factor>_>::clear(&this->m_beliefs);
  sVar7 = graphical_model::nvar(&this->m_gmo);
  factor::factor((factor *)&elapsed,1.0);
  std::vector<merlin::factor,_std::allocator<merlin::factor>_>::resize
            (&this->m_beliefs,sVar7,(value_type *)&elapsed);
  factor::~factor((factor *)&elapsed);
  if (0 < this->m_verbose) {
    dVar14 = timeSystem();
    dVar13 = (this->super_algorithm).m_start_time;
    poVar4 = std::operator<<((ostream *)&std::cout,"[CTE] Number of cliques  : ");
    sVar5 = std::vector<merlin::detail::node,_std::allocator<merlin::detail::node>_>::size
                      (&this->m_clusters);
    pvVar8 = (void *)std::ostream::operator<<(poVar4,sVar5);
    std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"[CTE] Number of edges    : ");
    sVar5 = std::vector<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>::size
                      (&this->m_edges);
    pvVar8 = (void *)std::ostream::operator<<(poVar4,sVar5);
    std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"[CTE] Max clique size    : ");
    pvVar8 = (void *)std::ostream::operator<<(poVar4,max_sepset_size);
    std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"[CTE] Max separator size : ");
    pvVar8 = (void *)std::ostream::operator<<(poVar4,i_2);
    std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"[CTE] Finished initialization in ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar14 - dVar13);
    poVar4 = std::operator<<(poVar4," seconds");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  std::
  vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
             *)&max_clique_size);
  graph::~graph((graph *)&clusters.
                          super__Vector_base<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>::~vector
            ((vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> *)&i_1);
  return extraout_EAX;
}

Assistant:

void cte::init() {

	// Prologue
	if (m_verbose > 0) {
		std::cout << "[CTE] + inference task   : " << m_task << std::endl;
	}

	if (m_query.empty() == false) {
		if (m_verbose > 0) {
			std::cout << "[CTE] + query vars       : ";
			std::copy(m_query.begin(), m_query.end(), std::ostream_iterator<vindex>(std::cout, " "));
			std::cout << std::endl;
		}

		// Add a dummy factor over the query variables
		if (m_query.size() <= MERLIN_MAXSIZE_JOINT_MARGINAL) {
			variable_set scope;
			for (size_t i = 0; i < m_query.size(); ++i) {
				scope |= m_gmo.var(m_query[i]);
			}

			factor q(scope, 1.0);
			m_gmo.add_factor(q);
		}
	}

	if (m_order.size() == 0) { // if we need to construct an elimination ordering
		m_order = m_gmo.order(m_order_method);
	}


	if (m_verbose > 0) {
		std::cout << "[CTE] + ordering method  : " << m_order_method << std::endl;
		std::cout << "[CTE] + elimination      : ";
		std::copy(m_order.begin(), m_order.end(),
				std::ostream_iterator<size_t>(std::cout, " "));
		std::cout << std::endl;

		// Calculate the induced width of the elimination ordering
		size_t wstar = m_gmo.induced_width(m_order);
		std::cout << "[CTE] + induced width    : " << wstar << std::endl;
		std::cout << "[CTE] + exact inference  : Yes" << std::endl;
		std::cout << "[CTE] + ordering time    : " << (timeSystem() - m_start_time) << " seconds" << std::endl;
		std::cout << "[CTE] Building clique tree ... " << std::endl;
	}

	// Get the factors scopes
	size_t n = m_gmo.num_nodes();
	std::vector<variable_set> fin;
	for (std::vector<factor>::const_iterator i = m_gmo.get_factors().begin();
			i != m_gmo.get_factors().end(); ++i) {
		fin.push_back((*i).vars());
	}

	// Create the graph
	graph g(n);
	g.init(fin);

	// Triangulate the graph
	g.triangulate(m_order);

	// Find the maximal cliques
	std::vector<std::set<size_t> > clusters = g.maximal_cliques(m_order);

	// Build the clique tree
	build_clique_tree(clusters);

	if (m_verbose > 0) {
		std::cout << "[CTE] Created clique tree with " << m_clusters.size()
				<< " clique factors" << std::endl;
	}

	size_t max_clique_size = 0, max_sepset_size = 0;
	for (size_t i = 0; i < m_edges.size(); ++i) {
		detail::edge* e = m_edges[i];
		max_clique_size = std::max(max_clique_size, e->first->clique.size());
		max_clique_size = std::max(max_clique_size, e->second->clique.size());
		max_sepset_size = std::max(max_sepset_size, e->sepset.size());
	}

	// Initialize beliefs (marginals)
	m_logz = 0;
	m_beliefs.clear();
	m_beliefs.resize(m_gmo.nvar(), factor(1.0));

	// Output the bucket tree statistics
	if (m_verbose > 0) {
		double elapsed = (timeSystem() - m_start_time);
		std::cout << "[CTE] Number of cliques  : " << m_clusters.size() << std::endl;
		std::cout << "[CTE] Number of edges    : " << m_edges.size() << std::endl;
		std::cout << "[CTE] Max clique size    : " << max_clique_size << std::endl;
		std::cout << "[CTE] Max separator size : " << max_sepset_size << std::endl;
		std::cout << "[CTE] Finished initialization in " << elapsed << " seconds" << std::endl;
	}
}